

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  ushort *puVar1;
  int a_00;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  stbi_uc *psVar8;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  stbi_uc *psVar19;
  uint uVar20;
  int iVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  byte *pbVar25;
  stbi_uc *psVar26;
  byte *pbVar27;
  byte bVar28;
  ulong uVar29;
  byte bVar30;
  int iVar31;
  uint uVar32;
  stbi_uc *psVar33;
  int iVar34;
  uint uVar35;
  long lVar36;
  uint uVar37;
  long lVar38;
  ulong uVar39;
  bool bVar40;
  int local_c8;
  ulong local_60;
  ulong uVar9;
  
  bVar40 = depth == 0x10;
  uVar4 = x * out_n;
  uVar5 = uVar4 << bVar40;
  a_00 = a->s->img_n;
  lVar36 = (long)a_00;
  uVar39 = (ulong)(uint)(a_00 << bVar40);
  psVar8 = (stbi_uc *)stbi__malloc_mad3(x,y,out_n << bVar40,0);
  a->out = psVar8;
  if (psVar8 == (stbi_uc *)0x0) {
    stbi__g_failure_reason = "outofmem";
  }
  else {
    iVar6 = stbi__mad3sizes_valid(a_00,x,depth,7);
    if (iVar6 == 0) {
      stbi__g_failure_reason = "too large";
    }
    else {
      iVar6 = a_00 * x;
      uVar7 = iVar6 * depth + 7U >> 3;
      uVar9 = (ulong)uVar7;
      if ((uVar7 + 1) * y <= raw_len) {
        if (y != 0) {
          uVar7 = uVar4 - uVar7;
          if (7 < depth) {
            uVar7 = 0;
          }
          uVar23 = (ulong)uVar7;
          uVar17 = (ulong)uVar5;
          lVar22 = -uVar17;
          lVar38 = (long)(out_n << bVar40);
          uVar7 = 0 << bVar40;
          iVar10 = x - 1;
          lVar11 = uVar23 - lVar38;
          lVar24 = uVar23 - uVar17;
          uVar15 = 0;
          local_60 = (ulong)x;
          do {
            uVar14 = (ulong)uVar7;
            pbVar25 = raw + 1;
            bVar2 = *raw;
            if ((ulong)bVar2 < 5) {
              if (depth < 8) {
                uVar39 = 1;
                local_60 = uVar9;
              }
              bVar3 = bVar2;
              if (uVar15 == 0) {
                bVar3 = ""[bVar2];
              }
              psVar8 = a->out;
              iVar34 = (int)uVar39;
              if (0 < iVar34) {
                lVar18 = lVar22 + uVar14 + uVar23;
                uVar29 = 0;
                do {
                  switch(bVar3) {
                  case 0:
                  case 1:
                  case 5:
                  case 6:
                    bVar30 = pbVar25[uVar29];
                    goto LAB_00109cc5;
                  case 2:
                  case 4:
                    bVar30 = psVar8[uVar29 + lVar18];
                    break;
                  case 3:
                    bVar30 = psVar8[uVar29 + lVar18] >> 1;
                    break;
                  default:
                    goto switchD_00109cab_default;
                  }
                  bVar30 = bVar30 + pbVar25[uVar29];
LAB_00109cc5:
                  psVar8[uVar29 + uVar14 + uVar23] = bVar30;
switchD_00109cab_default:
                  uVar29 = uVar29 + 1;
                } while (uVar39 != uVar29);
              }
              local_c8 = (int)uVar15;
              lVar18 = uVar5 * local_c8 + uVar23;
              if (depth == 8) {
                lVar13 = (long)out_n;
                lVar12 = lVar36;
                if (a_00 != out_n) {
                  psVar8[lVar36 + lVar18] = 0xff;
                }
LAB_00109d3b:
                pbVar25 = pbVar25 + lVar12;
              }
              else {
                if (depth == 0x10) {
                  lVar12 = (long)iVar34;
                  lVar13 = lVar38;
                  if (a_00 != out_n) {
                    (psVar8 + lVar12 + lVar18)[0] = 0xff;
                    (psVar8 + lVar12 + lVar18)[1] = 0xff;
                  }
                  goto LAB_00109d3b;
                }
                pbVar25 = raw + 2;
                lVar13 = 1;
              }
              psVar33 = psVar8 + lVar13 + lVar18;
              if (a_00 == out_n || depth < 8) {
                uVar16 = ((int)local_60 + -1) * iVar34;
                switch(bVar3) {
                case 0:
                  memcpy(psVar33,pbVar25,(long)(int)uVar16);
                  break;
                case 1:
                  if (0 < (int)uVar16) {
                    uVar29 = 0;
                    do {
                      psVar8[uVar29 + lVar13 + uVar14 + uVar23] =
                           psVar8[uVar29 + ((lVar13 + uVar14) - (long)iVar34) + uVar23] +
                           pbVar25[uVar29];
                      uVar29 = uVar29 + 1;
                    } while (uVar16 != uVar29);
                  }
                  break;
                case 2:
                  if (0 < (int)uVar16) {
                    lVar18 = lVar13 + uVar14 + uVar23;
                    uVar14 = 0;
                    do {
                      psVar8[uVar14 + lVar18] = psVar8[uVar14 + lVar22 + lVar18] + pbVar25[uVar14];
                      uVar14 = uVar14 + 1;
                    } while (uVar16 != uVar14);
                  }
                  break;
                case 3:
                  if (0 < (int)uVar16) {
                    lVar13 = lVar13 + uVar14;
                    uVar14 = 0;
                    do {
                      psVar8[uVar14 + lVar13 + uVar23] =
                           (char)((uint)psVar8[uVar14 + (lVar13 - iVar34) + uVar23] +
                                  (uint)psVar8[uVar14 + lVar13 + lVar24] >> 1) + pbVar25[uVar14];
                      uVar14 = uVar14 + 1;
                    } while (uVar16 != uVar14);
                  }
                  break;
                case 4:
                  if (0 < (int)uVar16) {
                    lVar13 = lVar13 + uVar14;
                    uVar14 = 0;
                    do {
                      bVar3 = psVar8[uVar14 + (lVar13 - iVar34) + uVar23];
                      bVar30 = psVar8[uVar14 + lVar13 + lVar24];
                      bVar28 = psVar8[uVar14 + (lVar13 - iVar34) + lVar24];
                      iVar31 = ((uint)bVar30 + (uint)bVar3) - (uint)bVar28;
                      uVar35 = iVar31 - (uint)bVar3;
                      uVar20 = -uVar35;
                      if (0 < (int)uVar35) {
                        uVar20 = uVar35;
                      }
                      uVar37 = iVar31 - (uint)bVar30;
                      uVar35 = -uVar37;
                      if (0 < (int)uVar37) {
                        uVar35 = uVar37;
                      }
                      uVar32 = iVar31 - (uint)bVar28;
                      uVar37 = -uVar32;
                      if (0 < (int)uVar32) {
                        uVar37 = uVar32;
                      }
                      if (uVar35 <= uVar37) {
                        bVar28 = bVar30;
                      }
                      if (uVar37 < uVar20) {
                        bVar3 = bVar28;
                      }
                      if (uVar35 < uVar20) {
                        bVar3 = bVar28;
                      }
                      psVar8[uVar14 + lVar13 + uVar23] = bVar3 + pbVar25[uVar14];
                      uVar14 = uVar14 + 1;
                    } while (uVar16 != uVar14);
                  }
                  break;
                case 5:
                  if (0 < (int)uVar16) {
                    uVar29 = 0;
                    do {
                      psVar8[uVar29 + lVar13 + uVar14 + uVar23] =
                           (psVar8[uVar29 + ((lVar13 + uVar14) - (long)iVar34) + uVar23] >> 1) +
                           pbVar25[uVar29];
                      uVar29 = uVar29 + 1;
                    } while (uVar16 != uVar29);
                  }
                  break;
                case 6:
                  if (0 < (int)uVar16) {
                    uVar29 = 0;
                    do {
                      psVar8[uVar29 + lVar13 + uVar14 + uVar23] =
                           psVar8[uVar29 + ((lVar13 + uVar14) - (long)iVar34) + uVar23] +
                           pbVar25[uVar29];
                      uVar29 = uVar29 + 1;
                    } while (uVar16 != uVar29);
                  }
                }
                pbVar25 = pbVar25 + (int)uVar16;
              }
              else {
                if (bVar3 < 7) {
                  psVar19 = psVar8 + lVar13 + lVar22 + lVar18;
                  switch(bVar3) {
                  case 0:
                    if (iVar10 != 0) {
                      iVar31 = iVar10;
                      do {
                        if (0 < iVar34) {
                          uVar29 = 0;
                          do {
                            psVar33[uVar29] = pbVar25[uVar29];
                            uVar29 = uVar29 + 1;
                          } while (uVar39 != uVar29);
                        }
                        psVar33[iVar34] = 0xff;
                        pbVar25 = pbVar25 + iVar34;
                        psVar33 = psVar33 + lVar38;
                        iVar31 = iVar31 + -1;
                      } while (iVar31 != 0);
                    }
                    break;
                  case 1:
                    if (iVar10 != 0) {
                      psVar8 = psVar8 + lVar13 + uVar14 + lVar11;
                      iVar31 = iVar10;
                      do {
                        if (0 < iVar34) {
                          uVar29 = 0;
                          do {
                            psVar33[uVar29] = psVar8[uVar29] + pbVar25[uVar29];
                            uVar29 = uVar29 + 1;
                          } while (uVar39 != uVar29);
                        }
                        psVar33[iVar34] = 0xff;
                        pbVar25 = pbVar25 + iVar34;
                        psVar33 = psVar33 + lVar38;
                        psVar8 = psVar8 + lVar38;
                        iVar31 = iVar31 + -1;
                      } while (iVar31 != 0);
                    }
                    break;
                  case 2:
                    if (iVar10 != 0) {
                      iVar31 = iVar10;
                      do {
                        if (0 < iVar34) {
                          uVar29 = 0;
                          do {
                            psVar33[uVar29] = psVar33[uVar29 + lVar22] + pbVar25[uVar29];
                            uVar29 = uVar29 + 1;
                          } while (uVar39 != uVar29);
                        }
                        psVar33[iVar34] = 0xff;
                        pbVar25 = pbVar25 + iVar34;
                        psVar33 = psVar33 + lVar38;
                        iVar31 = iVar31 + -1;
                      } while (iVar31 != 0);
                    }
                    break;
                  case 3:
                    if (iVar10 != 0) {
                      psVar8 = psVar8 + lVar13 + uVar14 + lVar11;
                      iVar31 = iVar10;
                      do {
                        if (0 < iVar34) {
                          uVar29 = 0;
                          do {
                            psVar33[uVar29] =
                                 (char)((uint)psVar8[uVar29] + (uint)psVar19[uVar29] >> 1) +
                                 pbVar25[uVar29];
                            uVar29 = uVar29 + 1;
                          } while (uVar39 != uVar29);
                        }
                        psVar33[iVar34] = 0xff;
                        pbVar25 = pbVar25 + iVar34;
                        psVar33 = psVar33 + lVar38;
                        psVar19 = psVar19 + lVar38;
                        psVar8 = psVar8 + lVar38;
                        iVar31 = iVar31 + -1;
                      } while (iVar31 != 0);
                    }
                    break;
                  case 4:
                    if (iVar10 != 0) {
                      psVar26 = psVar8 + lVar13 + uVar14 + lVar11;
                      psVar8 = psVar8 + lVar13 + uVar14 + (lVar11 - uVar17);
                      iVar31 = iVar10;
                      do {
                        if (0 < iVar34) {
                          uVar29 = 0;
                          do {
                            bVar3 = psVar26[uVar29];
                            bVar30 = psVar19[uVar29];
                            bVar28 = psVar8[uVar29];
                            iVar21 = ((uint)bVar30 + (uint)bVar3) - (uint)bVar28;
                            uVar20 = iVar21 - (uint)bVar3;
                            uVar16 = -uVar20;
                            if (0 < (int)uVar20) {
                              uVar16 = uVar20;
                            }
                            uVar35 = iVar21 - (uint)bVar30;
                            uVar20 = -uVar35;
                            if (0 < (int)uVar35) {
                              uVar20 = uVar35;
                            }
                            uVar37 = iVar21 - (uint)bVar28;
                            uVar35 = -uVar37;
                            if (0 < (int)uVar37) {
                              uVar35 = uVar37;
                            }
                            if (uVar20 <= uVar35) {
                              bVar28 = bVar30;
                            }
                            if (uVar35 < uVar16) {
                              bVar3 = bVar28;
                            }
                            if (uVar20 < uVar16) {
                              bVar3 = bVar28;
                            }
                            psVar33[uVar29] = bVar3 + pbVar25[uVar29];
                            uVar29 = uVar29 + 1;
                          } while (uVar39 != uVar29);
                        }
                        psVar33[iVar34] = 0xff;
                        pbVar25 = pbVar25 + iVar34;
                        psVar33 = psVar33 + lVar38;
                        psVar19 = psVar19 + lVar38;
                        psVar26 = psVar26 + lVar38;
                        psVar8 = psVar8 + lVar38;
                        iVar31 = iVar31 + -1;
                      } while (iVar31 != 0);
                    }
                    break;
                  case 5:
                    if (iVar10 != 0) {
                      psVar8 = psVar8 + lVar13 + uVar14 + lVar11;
                      iVar31 = iVar10;
                      do {
                        if (0 < iVar34) {
                          uVar29 = 0;
                          do {
                            psVar33[uVar29] = (psVar8[uVar29] >> 1) + pbVar25[uVar29];
                            uVar29 = uVar29 + 1;
                          } while (uVar39 != uVar29);
                        }
                        psVar33[iVar34] = 0xff;
                        pbVar25 = pbVar25 + iVar34;
                        psVar33 = psVar33 + lVar38;
                        psVar8 = psVar8 + lVar38;
                        iVar31 = iVar31 + -1;
                      } while (iVar31 != 0);
                    }
                    break;
                  case 6:
                    if (iVar10 != 0) {
                      psVar8 = psVar8 + lVar13 + uVar14 + lVar11;
                      iVar31 = iVar10;
                      do {
                        if (0 < iVar34) {
                          uVar29 = 0;
                          do {
                            psVar33[uVar29] = psVar8[uVar29] + pbVar25[uVar29];
                            uVar29 = uVar29 + 1;
                          } while (uVar39 != uVar29);
                        }
                        psVar33[iVar34] = 0xff;
                        pbVar25 = pbVar25 + iVar34;
                        psVar33 = psVar33 + lVar38;
                        psVar8 = psVar8 + lVar38;
                        iVar31 = iVar31 + -1;
                      } while (iVar31 != 0);
                    }
                  }
                }
                if (x != 0 && depth == 0x10) {
                  psVar8 = a->out + (long)iVar34 + uVar14 + 1;
                  uVar14 = (ulong)x;
                  do {
                    *psVar8 = 0xff;
                    psVar8 = psVar8 + lVar38;
                    uVar16 = (int)uVar14 - 1;
                    uVar14 = (ulong)uVar16;
                  } while (uVar16 != 0);
                }
              }
            }
            else {
              stbi__g_failure_reason = "invalid filter";
            }
            if (4 < bVar2) {
              return 0;
            }
            uVar15 = uVar15 + 1;
            uVar7 = uVar7 + uVar5;
            raw = pbVar25;
          } while (uVar15 != y);
        }
        if (7 < depth) {
          if (depth != 0x10) {
            return 1;
          }
          if (uVar4 * y != 0) {
            psVar8 = a->out;
            lVar36 = 0;
            do {
              puVar1 = (ushort *)(psVar8 + lVar36 * 2);
              *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
              lVar36 = lVar36 + 1;
            } while (uVar4 * y != (int)lVar36);
            return 1;
          }
          return 1;
        }
        if (y == 0) {
          return 1;
        }
        uVar7 = x - 1;
        lVar36 = uVar4 - uVar9;
        lVar11 = (ulong)uVar7 + 1;
        uVar16 = 0;
        uVar39 = 0;
        do {
          bVar2 = 1;
          if (color == 0) {
            bVar2 = ""[depth];
          }
          psVar8 = a->out;
          pbVar27 = psVar8 + uVar5 * (int)uVar39;
          pbVar25 = pbVar27 + (uVar4 - uVar9);
          uVar15 = (ulong)uVar16;
          if (depth == 4) {
            iVar10 = iVar6;
            if (1 < iVar6) {
              psVar33 = psVar8 + lVar36;
              iVar34 = iVar6;
              do {
                psVar8[uVar15] = (psVar33[uVar15] >> 4) * bVar2;
                psVar8[uVar15 + 1] = (psVar33[uVar15] & 0xf) * bVar2;
                iVar10 = iVar34 + -2;
                psVar33 = psVar33 + 1;
                psVar8 = psVar8 + 2;
                bVar40 = 3 < iVar34;
                iVar34 = iVar10;
              } while (bVar40);
              pbVar25 = psVar33 + uVar15;
              pbVar27 = psVar8 + uVar15;
            }
            if (iVar10 == 1) {
              bVar3 = *pbVar25 >> 4;
LAB_0010a628:
              bVar2 = bVar3 * bVar2;
LAB_0010a62b:
              *pbVar27 = bVar2;
            }
          }
          else if (depth == 2) {
            iVar10 = iVar6;
            if (3 < iVar6) {
              psVar33 = psVar8 + lVar36;
              iVar34 = iVar6;
              do {
                psVar8[uVar15] = (psVar33[uVar15] >> 6) * bVar2;
                psVar8[uVar15 + 1] = (psVar33[uVar15] >> 4 & 3) * bVar2;
                psVar8[uVar15 + 2] = (psVar33[uVar15] >> 2 & 3) * bVar2;
                psVar8[uVar15 + 3] = (psVar33[uVar15] & 3) * bVar2;
                iVar10 = iVar34 + -4;
                psVar33 = psVar33 + 1;
                psVar8 = psVar8 + 4;
                bVar40 = 7 < iVar34;
                iVar34 = iVar10;
              } while (bVar40);
              pbVar25 = psVar33 + uVar15;
              pbVar27 = psVar8 + uVar15;
            }
            if (0 < iVar10) {
              *pbVar27 = (*pbVar25 >> 6) * bVar2;
              pbVar27 = pbVar27 + 1;
            }
            if (1 < iVar10) {
              *pbVar27 = (*pbVar25 >> 4 & 3) * bVar2;
              pbVar27 = pbVar27 + 1;
            }
            if (iVar10 == 3) {
              bVar3 = *pbVar25 >> 2 & 3;
              goto LAB_0010a628;
            }
          }
          else if (depth == 1) {
            iVar10 = iVar6;
            if (7 < iVar6) {
              psVar33 = psVar8 + lVar36;
              iVar34 = iVar6;
              do {
                psVar8[uVar15] = (char)psVar33[uVar15] >> 7 & bVar2;
                psVar8[uVar15 + 1] = (char)(psVar33[uVar15] * '\x02') >> 7 & bVar2;
                psVar8[uVar15 + 2] = (char)(psVar33[uVar15] << 2) >> 7 & bVar2;
                psVar8[uVar15 + 3] = (char)(psVar33[uVar15] << 3) >> 7 & bVar2;
                psVar8[uVar15 + 4] = (char)(psVar33[uVar15] << 4) >> 7 & bVar2;
                psVar8[uVar15 + 5] = (char)(psVar33[uVar15] << 5) >> 7 & bVar2;
                psVar8[uVar15 + 6] = (char)(psVar33[uVar15] << 6) >> 7 & bVar2;
                bVar3 = bVar2;
                if ((psVar33[uVar15] & 1) == 0) {
                  bVar3 = 0;
                }
                psVar8[uVar15 + 7] = bVar3;
                iVar10 = iVar34 + -8;
                psVar33 = psVar33 + 1;
                psVar8 = psVar8 + 8;
                bVar40 = 0xf < iVar34;
                iVar34 = iVar10;
              } while (bVar40);
              pbVar25 = psVar33 + uVar15;
              pbVar27 = psVar8 + uVar15;
            }
            if (0 < iVar10) {
              *pbVar27 = (char)*pbVar25 >> 7 & bVar2;
              pbVar27 = pbVar27 + 1;
            }
            if (1 < iVar10) {
              *pbVar27 = (char)(*pbVar25 * '\x02') >> 7 & bVar2;
              pbVar27 = pbVar27 + 1;
            }
            if (2 < iVar10) {
              *pbVar27 = (char)(*pbVar25 << 2) >> 7 & bVar2;
              pbVar27 = pbVar27 + 1;
            }
            if (3 < iVar10) {
              *pbVar27 = (char)(*pbVar25 << 3) >> 7 & bVar2;
              pbVar27 = pbVar27 + 1;
            }
            if (4 < iVar10) {
              *pbVar27 = (char)(*pbVar25 << 4) >> 7 & bVar2;
              pbVar27 = pbVar27 + 1;
            }
            if (5 < iVar10) {
              *pbVar27 = (char)(*pbVar25 << 5) >> 7 & bVar2;
              pbVar27 = pbVar27 + 1;
            }
            if (iVar10 == 7) {
              bVar2 = (char)(*pbVar25 << 6) >> 7 & bVar2;
              goto LAB_0010a62b;
            }
          }
          if (a_00 != out_n) {
            psVar8 = a->out;
            if (a_00 == 1) {
              lVar22 = lVar11;
              if (-1 < (int)uVar7) {
                do {
                  psVar8[lVar22 * 2 + (uVar15 - 1)] = 0xff;
                  psVar8[lVar22 * 2 + (uVar15 - 2)] = psVar8[lVar22 + (uVar15 - 1)];
                  lVar24 = lVar22 + -1;
                  bVar40 = 0 < lVar22;
                  lVar22 = lVar24;
                } while (lVar24 != 0 && bVar40);
              }
            }
            else if (-1 < (int)uVar7) {
              psVar33 = psVar8 + (ulong)uVar7 * 3 + 2 + uVar15;
              lVar22 = lVar11;
              do {
                psVar8[lVar22 * 4 + (uVar15 - 1)] = 0xff;
                psVar8[lVar22 * 4 + (uVar15 - 2)] = *psVar33;
                psVar8[lVar22 * 4 + (uVar15 - 3)] = psVar33[-1];
                psVar8[lVar22 * 4 + (uVar15 - 4)] = psVar33[-2];
                psVar33 = psVar33 + -3;
                lVar24 = lVar22 + -1;
                bVar40 = 0 < lVar22;
                lVar22 = lVar24;
              } while (lVar24 != 0 && bVar40);
            }
          }
          uVar39 = uVar39 + 1;
          uVar16 = uVar16 + uVar5;
          if (uVar39 == y) {
            return 1;
          }
        } while( true );
      }
      stbi__g_failure_reason = "not enough pixels";
    }
  }
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   if (!stbi__mad3sizes_valid(img_n, x, depth, 7)) return stbi__err("too large", "Corrupt PNG");
   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;

   // we used to check for exact match between raw_len and img_len on non-interlaced PNGs,
   // but issue #276 reported a PNG in the wild that had extra data at the end (all zeros),
   // so just check for raw_len < img_len always.
   if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior;
      int filter = *raw++;

      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         STBI_ASSERT(img_width_bytes <= x);
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }
      prior = cur - stride; // bugfix: need to compute this after 'cur +=' computation above

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else if (depth == 16) {
         if (img_n != out_n) {
            cur[filter_bytes]   = 255; // first pixel top byte
            cur[filter_bytes+1] = 255; // first pixel bottom byte
         }
         raw += filter_bytes;
         cur += output_bytes;
         prior += output_bytes;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*filter_bytes;
         #define STBI__CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); } break;
         }
         #undef STBI__CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define STBI__CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[filter_bytes]=255,raw+=filter_bytes,cur+=output_bytes,prior+=output_bytes) \
                   for (k=0; k < filter_bytes; ++k)
         switch (filter) {
            STBI__CASE(STBI__F_none)         { cur[k] = raw[k]; } break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k- output_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k- output_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],prior[k],prior[k- output_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k- output_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],0,0)); } break;
         }
         #undef STBI__CASE

         // the loop above sets the high byte of the pixels' alpha, but for
         // 16 bit png files we also need the low byte set. we'll do that here.
         if (depth == 16) {
            cur = a->out + stride*j; // start at the beginning of the row again
            for (i=0; i < x; ++i,cur+=output_bytes) {
               cur[filter_bytes+1] = 255;
            }
         }
      }